

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O2

bool cmBlockCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  __uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_> _Var2;
  bool bVar3;
  int iVar4;
  tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_> this;
  long lVar5;
  undefined8 b;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view name;
  string_view name_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  ScopeSet scopes;
  cmMakefile *local_140;
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_138;
  __uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
  local_130;
  undefined1 local_128 [24];
  _Any_data _Stack_110;
  _Manager_type p_Stack_100;
  _Invoker_type local_f8;
  undefined1 auStack_f0 [8];
  _Function_base local_e8;
  pointer ppStack_d0;
  pointer local_c8;
  pointer ppStack_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  Arguments parsedArgs;
  
  if (cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar4 = __cxa_guard_acquire(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar4 != 0) {
      local_c8 = (pointer)0x0;
      ppStack_c0 = (pointer)0x0;
      local_e8._M_manager = (_Manager_type)0x0;
      ppStack_d0 = (pointer)0x0;
      local_e8._M_functor._0_8_ = 0;
      local_e8._M_functor._8_8_ = 0;
      local_f8 = (_Invoker_type)0x0;
      auStack_f0 = (undefined1  [8])0x0;
      _Stack_110._8_8_ = 0;
      p_Stack_100 = (_Manager_type)0x0;
      local_128._16_8_ =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      _Stack_110._M_unused._M_object = (void *)0x0;
      local_128._0_8_ = (ActionMap *)0x0;
      local_128._8_8_ = (pointer)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
           = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x30;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)
                std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                ::_M_invoke;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)
                  std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                  ::_M_manager;
      name._M_str = "SCOPE_FOR";
      name._M_len = 9;
      ArgumentParser::Base::Bind((Base *)local_128,name,(KeywordAction *)&parsedArgs);
      std::_Function_base::~_Function_base((_Function_base *)&parsedArgs);
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
           = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x50;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)
                std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                ::_M_invoke;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)
                  std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                  ::_M_manager;
      name_00._M_str = "PROPAGATE";
      name_00._M_len = 9;
      ArgumentParser::Base::Bind((Base *)local_128,name_00,(KeywordAction *)&parsedArgs);
      std::_Function_base::~_Function_base((_Function_base *)&parsedArgs);
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&cmBlockCommand::parser,(ActionMap *)local_128);
      ArgumentParser::ActionMap::~ActionMap((ActionMap *)local_128);
      __cxa_atexit(ArgumentParser::Base::~Base,&cmBlockCommand::parser,&__dso_handle);
      __cxa_guard_release(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  local_128._16_8_ = &unrecognizedArguments;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parsedArgs.ScopeFor.
  super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_engaged = false;
  parsedArgs.Propagate.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsedArgs.Propagate.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parsedArgs.Propagate.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._0_8_ = &cmBlockCommand::parser;
  local_128._8_8_ = &parsedArgs;
  _Stack_110._8_8_ = 0;
  p_Stack_100 = (_Manager_type)0x0;
  local_f8 = (_Invoker_type)0x0;
  auStack_f0 = (undefined1  [8])0x0;
  local_e8._M_functor._0_8_ = 0;
  local_e8._M_functor._8_8_ = 0;
  local_e8._M_manager = (_Manager_type)0x0;
  ppStack_d0 = (pointer)0x0;
  local_c8 = (pointer)((ulong)local_c8 & 0xffffffffffffff00);
  _Stack_110._M_unused._0_8_ = (undefined8)local_128._8_8_;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)local_128,args,0);
  std::_Function_base::~_Function_base(&local_e8);
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = ArgumentParser::ParseResult::MaybeReportError
                      (&parsedArgs.super_ParseResult,status->Makefile);
    if (bVar3) {
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    else {
      scopes.Set.super__Base_bitset<1UL>._M_w = (bitset<8UL>)(_Base_bitset<1UL>)0x0;
      if (parsedArgs.ScopeFor.
          super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_engaged == true) {
        for (b = parsedArgs.ScopeFor.
                 super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_payload._M_value.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (pointer)b !=
            parsedArgs.ScopeFor.
            super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_payload._M_value.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; b = b + 0x20) {
          __y._M_str = "VARIABLES";
          __y._M_len = 9;
          __x._M_str = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b)->
                       _M_dataplus)._M_p;
          __x._M_len = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b)->
                       _M_string_length;
          bVar3 = std::operator==(__x,__y);
          if (bVar3) {
            cm::enum_set<(anonymous_namespace)::ScopeType,_0>::insert
                      ((pair<cm::enum_set_iterator<cm::enum_set<(anonymous_namespace)::ScopeType,_0>_>,_bool>
                        *)local_128,&scopes,VARIABLES);
          }
          else {
            __y_00._M_str = "POLICIES";
            __y_00._M_len = 8;
            __x_00._M_str =
                 (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b)->
                 _M_dataplus)._M_p;
            __x_00._M_len =
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b)->
                 _M_string_length;
            bVar3 = std::operator==(__x_00,__y_00);
            if (!bVar3) {
              local_140 = (cmMakefile *)CONCAT71(local_140._1_7_,0x22);
              cmStrCat<char_const(&)[30],std::__cxx11::string_const&,char>
                        ((string *)local_128,(char (*) [30])"SCOPE_FOR unsupported scope \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b,
                         (char *)&local_140);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_003020a5;
            }
            cm::enum_set<(anonymous_namespace)::ScopeType,_0>::insert
                      ((pair<cm::enum_set_iterator<cm::enum_set<(anonymous_namespace)::ScopeType,_0>_>,_bool>
                        *)local_128,&scopes,POLICIES);
          }
        }
      }
      else {
        scopes.Set.super__Base_bitset<1UL>._M_w = (bitset<8UL>)(_Base_bitset<1UL>)0x0;
        local_128._0_2_ = 0x100;
        for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
          std::bitset<8UL>::set(&scopes.Set,(ulong)(byte)local_128[lVar5],true);
        }
      }
      bVar3 = std::bitset<8UL>::test(&scopes.Set,0);
      if ((!bVar3) &&
         (parsedArgs.Propagate.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          parsedArgs.Propagate.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_128,
                   "PROPAGATE cannot be specified without a new scope for VARIABLES",
                   (allocator<char> *)&local_140);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_003020a5;
      }
      pcVar1 = status->Makefile;
      this.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           operator_new(0xd0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128,
               &parsedArgs.Propagate.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      cmFunctionBlocker::cmFunctionBlocker
                ((cmFunctionBlocker *)
                 this.
                 super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                 .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl);
      *(undefined ***)
       this.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
       super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           &PTR__cmBlockFunctionBlocker_0098fe08;
      ((cmFunctionBlocker *)
      ((long)this.
             super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
             super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98))->
      _vptr_cmFunctionBlocker = (_func_int **)pcVar1;
      (((cmListFileContext *)
       ((long)this.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa0))->Name).
      _M_dataplus._M_p = (pointer)scopes.Set.super__Base_bitset<1UL>._M_w;
      *(size_type *)
       ((long)this.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8) = 0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)this.
                 super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                 .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb0))->
      _M_allocated_capacity = 0;
      local_140 = pcVar1;
      bVar3 = std::bitset<8UL>::test(&scopes.Set,1);
      if (bVar3) {
        std::make_unique<cmMakefile::PolicyPushPop,cmMakefile*&>((cmMakefile **)&local_130);
        _Var2._M_t.
        super__Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
        .super__Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false>._M_head_impl =
             local_130._M_t.
             super__Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
             .super__Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false>._M_head_impl;
        local_130._M_t.
        super__Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
        .super__Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false>._M_head_impl =
             (tuple<cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>)
             (_Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
              )0x0;
        std::
        __uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
        ::reset((__uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
                 *)((long)this.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8),
                (pointer)_Var2._M_t.
                         super__Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
                         .super__Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false>._M_head_impl);
        std::unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
        ::~unique_ptr((unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
                       *)&local_130);
      }
      bVar3 = std::bitset<8UL>::test(&scopes.Set,0);
      if (bVar3) {
        std::make_unique<cmMakefile::VariablePushPop,cmMakefile*&>((cmMakefile **)&local_130);
        _Var2._M_t.
        super__Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
        .super__Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false>._M_head_impl =
             local_130._M_t.
             super__Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
             .super__Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false>._M_head_impl;
        local_130._M_t.
        super__Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
        .super__Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false>._M_head_impl =
             (tuple<cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>)
             (_Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
              )0x0;
        std::
        __uniq_ptr_impl<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
        ::reset((__uniq_ptr_impl<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
                 *)&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)this.
                               super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                               .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl +
                        0xb0))->_M_allocated_capacity,
                (pointer)_Var2._M_t.
                         super__Tuple_impl<0UL,_cmMakefile::PolicyPushPop_*,_std::default_delete<cmMakefile::PolicyPushPop>_>
                         .super__Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false>._M_head_impl);
        std::
        unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>::
        ~unique_ptr((unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
                     *)&local_130);
      }
      *(undefined8 *)
       ((long)this.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb8) =
           local_128._0_8_;
      (((string *)
       ((long)this.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xc0))->_M_dataplus).
      _M_p = (pointer)local_128._8_8_;
      *(undefined8 *)
       ((long)this.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 200) =
           local_128._16_8_;
      local_128._0_8_ = (ActionMap *)0x0;
      local_128._8_8_ = (Arguments *)0x0;
      local_128._16_8_ =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      local_138._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           this.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
           .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
      cmMakefile::AddFunctionBlocker
                (status->Makefile,
                 (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                 &local_138);
      if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
          local_138._M_t.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0
         ) {
        (**(code **)(*(long *)local_138._M_t.
                              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                              .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))
                  ();
      }
      local_138._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)0x0;
    }
    bVar3 = true;
  }
  else {
    local_140 = (cmMakefile *)CONCAT71(local_140._1_7_,0x22);
    cmStrCat<char_const(&)[35],std::__cxx11::string&,char>
              ((string *)local_128,(char (*) [35])"called with unsupported argument \"",
               unrecognizedArguments.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(char *)&local_140);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_003020a5:
    std::__cxx11::string::~string((string *)local_128);
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar3 = false;
  }
  cmBlockCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
  return bVar3;
}

Assistant:

bool cmBlockCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>> ScopeFor;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Propagate;
  };
  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("SCOPE_FOR"_s, &Arguments::ScopeFor)
                               .Bind("PROPAGATE"_s, &Arguments::Propagate);
  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs = parser.Parse(args, &unrecognizedArguments);

  if (!unrecognizedArguments.empty()) {
    status.SetError(cmStrCat("called with unsupported argument \"",
                             unrecognizedArguments[0], '"'));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  ScopeSet scopes;

  if (parsedArgs.ScopeFor) {
    for (auto const& scope : *parsedArgs.ScopeFor) {
      if (scope == "VARIABLES"_s) {
        scopes.insert(ScopeType::VARIABLES);
        continue;
      }
      if (scope == "POLICIES"_s) {
        scopes.insert(ScopeType::POLICIES);
        continue;
      }
      status.SetError(cmStrCat("SCOPE_FOR unsupported scope \"", scope, '"'));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  } else {
    scopes = { ScopeType::VARIABLES, ScopeType::POLICIES };
  }
  if (!scopes.contains(ScopeType::VARIABLES) &&
      !parsedArgs.Propagate.empty()) {
    status.SetError(
      "PROPAGATE cannot be specified without a new scope for VARIABLES");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // create a function blocker
  auto fb = cm::make_unique<cmBlockFunctionBlocker>(
    &status.GetMakefile(), scopes, parsedArgs.Propagate);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}